

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O2

String * __thiscall
Args::eatOneValue<Args::CmdLine,Args::Context>
          (String *__return_storage_ptr__,Args *this,Context *context,String *errorDescription,
          CmdLine *cmdLine)

{
  String *name;
  ArgIface *pAVar1;
  BaseException *this_00;
  String SStack_48;
  
  name = *(String **)(this + 0x18);
  if (name != *(String **)(this + 8)) {
    *(String **)(this + 0x18) = name + 1;
    pAVar1 = CmdLine::findArgument((CmdLine *)errorDescription,name);
    if (pAVar1 == (ArgIface *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
      return __return_storage_ptr__;
    }
    if (*(long *)(this + 0x18) != *(long *)this) {
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -0x20;
    }
  }
  this_00 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&SStack_48,(string *)context);
  BaseException::BaseException(this_00,&SStack_48);
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

String eatOneValue( Ctx & context,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto val = context.next();

		if( !cmdLine->findArgument( *val ) )
			return *val;

		context.putBack();
	}

	throw BaseException( errorDescription );
}